

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_do(connectdata *conn,_Bool *done)

{
  void **ppvVar1;
  _Bool connected;
  curl_chunk_end_callback p_Var2;
  curl_llist *pcVar3;
  curl_chunk_bgn_callback p_Var4;
  CURLcode CVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  undefined8 *puVar9;
  ftp_parselist_data *pfVar10;
  curl_wildcard_states cVar11;
  SessionHandle *pSVar12;
  curl_wildcard_states cVar13;
  SessionHandle *pSVar14;
  CURLcode local_3c;
  
  *done = false;
  (conn->proto).ftpc.wait_data_conn = false;
  pSVar14 = conn->data;
  if ((pSVar14->set).wildcardmatch == true) {
    cVar13 = CURLWC_CLEAN;
    do {
      switch((pSVar14->wildcard).state) {
      case CURLWC_INIT:
        goto switchD_00481f6c_caseD_0;
      case CURLWC_MATCHING:
        puVar9 = (undefined8 *)(pSVar14->wildcard).tmp;
        (pSVar14->set).fwrite_func = (curl_write_callback)puVar9[1];
        (pSVar14->set).out = (void *)puVar9[2];
        puVar9[1] = 0;
        puVar9[2] = 0;
        (pSVar14->wildcard).state = CURLWC_DOWNLOADING;
        CVar5 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar9);
        cVar11 = cVar13;
        if (CVar5 != CURLE_OK) break;
        if (((pSVar14->wildcard).filelist)->size != 0) goto LAB_00482100;
        CVar5 = CURLE_REMOTE_FILE_NOT_FOUND;
        goto LAB_0048238b;
      case CURLWC_DOWNLOADING:
        puVar9 = (undefined8 *)((pSVar14->wildcard).filelist)->head->ptr;
        pcVar6 = curl_maprintf("%s%s",(pSVar14->wildcard).path,*puVar9);
        local_3c = CURLE_OUT_OF_MEMORY;
        if (pcVar6 == (char *)0x0) goto LAB_00482396;
        pSVar12 = conn->data;
        pcVar8 = (pSVar12->state).pathbuffer;
        if (pcVar8 != (char *)0x0) {
          (*Curl_cfree)(pcVar8);
          pSVar12 = conn->data;
          (pSVar12->state).pathbuffer = (char *)0x0;
        }
        (pSVar12->state).pathbuffer = pcVar6;
        (pSVar12->state).path = pcVar6;
        Curl_infof(pSVar12,"Wildcard - START of \"%s\"\n",*puVar9);
        p_Var4 = (conn->data->set).chunk_bgn;
        if (p_Var4 != (curl_chunk_bgn_callback)0x0) {
          lVar7 = (*p_Var4)(puVar9,(pSVar14->wildcard).customptr,
                            (int)((pSVar14->wildcard).filelist)->size);
          if (lVar7 == 2) {
            Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar9);
            cVar11 = CURLWC_SKIP;
            break;
          }
          if (lVar7 == 1) {
            local_3c = CURLE_CHUNK_FAILED;
            goto LAB_00482396;
          }
        }
        cVar11 = CURLWC_SKIP;
        if (*(int *)(puVar9 + 1) == 0) {
          if ((*(byte *)(puVar9 + 0xc) & 0x40) != 0) {
            (conn->proto).ftpc.known_filesize = puVar9[5];
          }
          local_3c = ftp_parse_url_path(conn);
          if (local_3c != CURLE_OK) goto LAB_00482396;
          pcVar3 = (pSVar14->wildcard).filelist;
          Curl_llist_remove(pcVar3,pcVar3->head,(void *)0x0);
          CVar5 = CURLE_OK;
          local_3c = CURLE_OK;
          if (((pSVar14->wildcard).filelist)->size != 0) goto LAB_00482396;
          goto LAB_0048238b;
        }
        break;
      case CURLWC_CLEAN:
        puVar9 = (undefined8 *)(pSVar14->wildcard).tmp;
        if (puVar9 == (undefined8 *)0x0) {
          CVar5 = CURLE_OK;
          cVar13 = CURLWC_DONE;
        }
        else {
          CVar5 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar9);
          cVar13 = (CVar5 == CURLE_OK) + CURLWC_ERROR;
        }
        goto LAB_0048238b;
      case CURLWC_SKIP:
        p_Var2 = (pSVar14->set).chunk_end;
        if (p_Var2 != (curl_chunk_end_callback)0x0) {
          (*p_Var2)((pSVar14->wildcard).customptr);
        }
        pcVar3 = (pSVar14->wildcard).filelist;
        Curl_llist_remove(pcVar3,pcVar3->head,(void *)0x0);
        cVar11 = (((pSVar14->wildcard).filelist)->size == 0) + CURLWC_DOWNLOADING;
        break;
      default:
        local_3c = CURLE_OK;
        goto LAB_00482396;
      }
      (pSVar14->wildcard).state = cVar11;
LAB_00482100:
      pSVar14 = conn->data;
    } while( true );
  }
  CVar5 = ftp_parse_url_path(conn);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  pSVar14 = conn->data;
  goto LAB_004823ba;
switchD_00481f6c_caseD_0:
  pcVar6 = (pSVar14->state).path;
  pcVar8 = strrchr(pcVar6,0x2f);
  if (pcVar8 == (char *)0x0) {
    if (*pcVar6 == '\0') goto LAB_004822e7;
    pcVar8 = (*Curl_cstrdup)(pcVar6);
    (pSVar14->wildcard).pattern = pcVar8;
LAB_0048222d:
    if (pcVar8 == (char *)0x0) {
LAB_00482369:
      CVar5 = CURLE_OUT_OF_MEMORY;
    }
    else {
      *pcVar6 = '\0';
      puVar9 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
      if (puVar9 == (undefined8 *)0x0) {
        pcVar6 = (pSVar14->wildcard).pattern;
        CVar5 = CURLE_OUT_OF_MEMORY;
        if (pcVar6 != (char *)0x0) {
          (*Curl_cfree)(pcVar6);
          (pSVar14->wildcard).pattern = (char *)0x0;
        }
      }
      else {
        pfVar10 = Curl_ftp_parselist_data_alloc();
        *puVar9 = pfVar10;
        if (pfVar10 == (ftp_parselist_data *)0x0) {
          pcVar6 = (pSVar14->wildcard).pattern;
          if (pcVar6 != (char *)0x0) {
            (*Curl_cfree)(pcVar6);
            (pSVar14->wildcard).pattern = (char *)0x0;
          }
          (*Curl_cfree)(puVar9);
          goto LAB_00482369;
        }
        (pSVar14->wildcard).tmp = puVar9;
        (pSVar14->wildcard).tmp_dtor = wc_data_dtor;
        if ((conn->data->set).ftp_filemethod == FTPFILE_NOCWD) {
          (conn->data->set).ftp_filemethod = FTPFILE_MULTICWD;
        }
        ppvVar1 = &(pSVar14->wildcard).tmp;
        CVar5 = ftp_parse_url_path(conn);
        if (CVar5 == CURLE_OK) {
          pcVar6 = (*Curl_cstrdup)((conn->data->state).path);
          (pSVar14->wildcard).path = pcVar6;
          if (pcVar6 == (char *)0x0) {
            pcVar6 = (pSVar14->wildcard).pattern;
            if (pcVar6 != (char *)0x0) {
              (*Curl_cfree)(pcVar6);
              (pSVar14->wildcard).pattern = (char *)0x0;
            }
            (*(pSVar14->wildcard).tmp_dtor)((pSVar14->wildcard).tmp);
            *ppvVar1 = (void *)0x0;
            (pSVar14->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
            goto LAB_00482369;
          }
          pSVar12 = conn->data;
          puVar9[1] = (pSVar12->set).fwrite_func;
          (pSVar12->set).fwrite_func = Curl_ftp_parselist;
          puVar9[2] = (pSVar12->set).out;
          (pSVar12->set).out = conn;
          Curl_infof(pSVar12,"Wildcard - Parsing started\n");
          CVar5 = CURLE_OK;
        }
        else {
          pcVar6 = (pSVar14->wildcard).pattern;
          if (pcVar6 != (char *)0x0) {
            (*Curl_cfree)(pcVar6);
            (pSVar14->wildcard).pattern = (char *)0x0;
          }
          (*(pSVar14->wildcard).tmp_dtor)((pSVar14->wildcard).tmp);
          *ppvVar1 = (void *)0x0;
          (pSVar14->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
        }
      }
    }
  }
  else {
    if (pcVar8[1] != '\0') {
      pcVar6 = pcVar8 + 1;
      pcVar8 = (*Curl_cstrdup)(pcVar6);
      (pSVar14->wildcard).pattern = pcVar8;
      goto LAB_0048222d;
    }
LAB_004822e7:
    (pSVar14->wildcard).state = CURLWC_CLEAN;
    CVar5 = ftp_parse_url_path(conn);
  }
  local_3c = CVar5;
  if ((pSVar14->wildcard).state != CURLWC_CLEAN) {
    cVar13 = (uint)(CVar5 != CURLE_OK) * 4 + CURLWC_MATCHING;
LAB_0048238b:
    (pSVar14->wildcard).state = cVar13;
    local_3c = CVar5;
  }
LAB_00482396:
  pSVar14 = conn->data;
  if (((pSVar14->wildcard).state | CURLWC_DOWNLOADING) == CURLWC_DONE) {
    return CURLE_OK;
  }
  if (local_3c != CURLE_OK) {
    return local_3c;
  }
LAB_004823ba:
  (pSVar14->req).size = -1;
  Curl_pgrsSetUploadCounter(pSVar14,0);
  Curl_pgrsSetDownloadCounter(pSVar14,0);
  Curl_pgrsSetUploadSize(pSVar14,-1);
  Curl_pgrsSetDownloadSize(pSVar14,-1);
  (conn->proto).ftpc.ctl_valid = true;
  if ((conn->data->set).opt_no_body == true) {
    *(undefined4 *)((long)(conn->data->req).protop + 0x18) = 1;
  }
  *done = false;
  CVar5 = ftp_state_quote(conn,true,FTP_QUOTE);
  if (CVar5 == CURLE_OK) {
    CVar5 = ftp_multi_statemach(conn,done);
    connected = (conn->bits).tcpconnect[1];
    Curl_infof(conn->data,"ftp_perform ends with SECONDARY: %d\n",(ulong)connected);
    if (CVar5 == CURLE_OK) {
      if (*done != true) {
        return CURLE_OK;
      }
      CVar5 = ftp_dophase_done(conn,connected);
      return CVar5;
    }
  }
  freedirs(&(conn->proto).ftpc);
  return CVar5;
}

Assistant:

static CURLcode ftp_do(struct connectdata *conn, bool *done)
{
  CURLcode retcode = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(conn->data->set.wildcardmatch) {
    retcode = wc_statemach(conn);
    if(conn->data->wildcard.state == CURLWC_SKIP ||
      conn->data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(retcode) /* error, loop or skipping the file */
      return retcode;
  }
  else { /* no wildcard FSM needed */
    retcode = ftp_parse_url_path(conn);
    if(retcode)
      return retcode;
  }

  retcode = ftp_regular_transfer(conn, done);

  return retcode;
}